

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_date.cpp
# Opt level: O0

ScalarFunctionSet * duckdb::MakeDateFun::GetFunctions(void)

{
  initializer_list<duckdb::LogicalType> iVar1;
  initializer_list<duckdb::LogicalType> iVar2;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>
  iVar3;
  initializer_list<duckdb::LogicalType> iVar4;
  bool bVar5;
  ScalarFunctionSet *in_RDI;
  ScalarFunction *func;
  iterator __end1;
  iterator __begin1;
  vector<duckdb::ScalarFunction,_true> *__range1;
  child_list_t<LogicalType> make_date_children;
  ScalarFunctionSet *make_date;
  allocator_type *in_stack_fffffffffffff6f8;
  ScalarFunction *pSVar6;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffff700;
  ScalarFunction *pSVar7;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_stack_fffffffffffff708;
  LogicalType *pLVar8;
  undefined4 in_stack_fffffffffffff710;
  undefined4 uVar9;
  undefined4 in_stack_fffffffffffff714;
  LogicalTypeId *in_stack_fffffffffffff730;
  char (*in_stack_fffffffffffff738) [6];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  *in_stack_fffffffffffff740;
  LogicalType *local_820;
  undefined1 **local_800;
  LogicalType *local_7e0;
  LogicalType *local_7c0;
  BaseScalarFunction local_798 [176];
  reference local_6e8;
  ScalarFunction *local_6e0;
  __normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
  local_6d8;
  ScalarFunctionSet *local_6d0;
  LogicalType local_6c8 [24];
  undefined1 local_6b0 [32];
  LogicalType local_690 [31];
  undefined1 local_671;
  undefined1 local_670 [24];
  LogicalType *local_658;
  LogicalType local_650 [24];
  LogicalType *local_638;
  undefined8 local_630;
  undefined1 local_628 [24];
  ScalarFunction local_610;
  undefined8 *local_4e0;
  undefined1 *local_4d8 [7];
  undefined1 local_4a0 [56];
  undefined1 local_468 [56];
  undefined8 *local_430;
  undefined8 local_428;
  LogicalType local_408 [24];
  undefined1 local_3f0 [32];
  LogicalType local_3d0 [32];
  LogicalType *local_3b0;
  LogicalType local_3a8 [24];
  LogicalType local_390 [24];
  LogicalType local_378 [24];
  LogicalType *local_360;
  undefined8 local_358;
  undefined1 local_350 [24];
  ScalarFunction local_338;
  LogicalType local_210 [24];
  undefined1 local_1f8 [32];
  LogicalType local_1d8 [32];
  LogicalType *local_1b8;
  LogicalType local_1b0 [24];
  LogicalType *local_198;
  undefined8 local_190;
  undefined1 local_188 [24];
  ScalarFunction local_170;
  allocator local_31;
  string local_30 [39];
  byte local_9;
  
  local_9 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"make_date",&local_31);
  duckdb::ScalarFunctionSet::ScalarFunctionSet(in_RDI,local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  local_1b8 = local_1b0;
  duckdb::LogicalType::LogicalType(local_1b8,INTEGER);
  local_198 = local_1b0;
  local_190 = 1;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0xbf567b);
  iVar1._M_len._0_4_ = in_stack_fffffffffffff710;
  iVar1._M_array = (iterator)in_stack_fffffffffffff708;
  iVar1._M_len._4_4_ = in_stack_fffffffffffff714;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffff700,iVar1,in_stack_fffffffffffff6f8);
  duckdb::LogicalType::LogicalType(local_1d8,DATE);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),in_stack_fffffffffffff708
            );
  duckdb::LogicalType::LogicalType(local_210,INVALID);
  pLVar8 = local_210;
  uVar9 = 0;
  pSVar7 = (ScalarFunction *)0x0;
  pSVar6 = (ScalarFunction *)0x0;
  duckdb::ScalarFunction::ScalarFunction(&local_170,local_188,local_1d8,local_1f8,0);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)pSVar7,pSVar6);
  ScalarFunction::~ScalarFunction(pSVar7);
  duckdb::LogicalType::~LogicalType(local_210);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0xbf577c);
  duckdb::LogicalType::~LogicalType(local_1d8);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xbf5796);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0xbf57a3);
  local_7c0 = (LogicalType *)&local_198;
  do {
    local_7c0 = local_7c0 + -0x18;
    duckdb::LogicalType::~LogicalType(local_7c0);
  } while (local_7c0 != local_1b0);
  local_3b0 = local_3a8;
  duckdb::LogicalType::LogicalType(local_3b0,BIGINT);
  local_3b0 = local_390;
  duckdb::LogicalType::LogicalType(local_3b0,BIGINT);
  local_3b0 = local_378;
  duckdb::LogicalType::LogicalType(local_3b0,BIGINT);
  local_360 = local_3a8;
  local_358 = 3;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0xbf587a);
  iVar2._M_len._0_4_ = uVar9;
  iVar2._M_array = pLVar8;
  iVar2._M_len._4_4_ = in_stack_fffffffffffff714;
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)pSVar7,iVar2,(allocator_type *)pSVar6);
  duckdb::LogicalType::LogicalType(local_3d0,DATE);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffff714,uVar9),
             (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)pLVar8);
  duckdb::LogicalType::LogicalType(local_408,INVALID);
  pLVar8 = local_408;
  uVar9 = 0;
  pSVar7 = (ScalarFunction *)0x0;
  pSVar6 = (ScalarFunction *)0x0;
  duckdb::ScalarFunction::ScalarFunction(&local_338,local_350,local_3d0,local_3f0,0);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)pSVar7,pSVar6);
  ScalarFunction::~ScalarFunction(pSVar7);
  duckdb::LogicalType::~LogicalType(local_408);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0xbf597b);
  duckdb::LogicalType::~LogicalType(local_3d0);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xbf5995);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0xbf59a2);
  local_7e0 = (LogicalType *)&local_360;
  do {
    local_7e0 = local_7e0 + -0x18;
    duckdb::LogicalType::~LogicalType(local_7e0);
  } while (local_7e0 != local_3a8);
  local_4e0 = local_4d8;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::pair<const_char_(&)[5],_const_duckdb::LogicalTypeId_&,_true>
            (in_stack_fffffffffffff740,(char (*) [5])in_stack_fffffffffffff738,
             in_stack_fffffffffffff730);
  local_4e0 = (undefined8 *)local_4a0;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::pair<const_char_(&)[6],_const_duckdb::LogicalTypeId_&,_true>
            (in_stack_fffffffffffff740,in_stack_fffffffffffff738,in_stack_fffffffffffff730);
  local_4e0 = (undefined8 *)local_468;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::pair<const_char_(&)[4],_const_duckdb::LogicalTypeId_&,_true>
            (in_stack_fffffffffffff740,(char (*) [4])in_stack_fffffffffffff738,
             in_stack_fffffffffffff730);
  local_430 = local_4d8;
  local_428 = 3;
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>
  ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>
               *)0xbf5a94);
  iVar3._M_len._0_4_ = uVar9;
  iVar3._M_array = (iterator)pLVar8;
  iVar3._M_len._4_4_ = in_stack_fffffffffffff714;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
            *)pSVar7,iVar3,(allocator_type *)pSVar6);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>
  ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>
                *)0xbf5ac8);
  local_800 = (undefined1 **)&local_430;
  do {
    local_800 = local_800 + -7;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
             *)pSVar7);
  } while (local_800 != local_4d8);
  local_671 = 1;
  local_658 = local_650;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
            *)pSVar7,
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
            *)pSVar6);
  duckdb::LogicalType::STRUCT(local_650,local_670);
  local_671 = 0;
  local_638 = local_650;
  local_630 = 1;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0xbf5b9b);
  iVar4._M_len._0_4_ = uVar9;
  iVar4._M_array = pLVar8;
  iVar4._M_len._4_4_ = in_stack_fffffffffffff714;
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)pSVar7,iVar4,(allocator_type *)pSVar6);
  duckdb::LogicalType::LogicalType(local_690,DATE);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffff714,uVar9),
             (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)pLVar8);
  duckdb::LogicalType::LogicalType(local_6c8,INVALID);
  pSVar7 = (ScalarFunction *)0x0;
  pSVar6 = (ScalarFunction *)0x0;
  duckdb::ScalarFunction::ScalarFunction(&local_610,local_628,local_690,local_6b0,0);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)pSVar7,pSVar6);
  ScalarFunction::~ScalarFunction(pSVar7);
  duckdb::LogicalType::~LogicalType(local_6c8);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0xbf5c9c);
  duckdb::LogicalType::~LogicalType(local_690);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xbf5cb6);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0xbf5cc3);
  local_820 = (LogicalType *)&local_638;
  do {
    local_820 = local_820 + -0x18;
    duckdb::LogicalType::~LogicalType(local_820);
  } while (local_820 != local_650);
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
             *)0xbf5d22);
  local_6d0 = in_RDI + 0x20;
  local_6d8._M_current =
       (ScalarFunction *)
       std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::begin(pSVar6);
  local_6e0 = (ScalarFunction *)
              std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::end
                        ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
                         pSVar6);
  while( true ) {
    bVar5 = __gnu_cxx::operator!=
                      ((__normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
                        *)pSVar7,
                       (__normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
                        *)pSVar6);
    if (!bVar5) break;
    local_6e8 = __gnu_cxx::
                __normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
                ::operator*(&local_6d8);
    BaseScalarFunction::SetReturnsError(&pSVar6->super_BaseScalarFunction);
    duckdb::BaseScalarFunction::~BaseScalarFunction(local_798);
    __gnu_cxx::
    __normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
    ::operator++(&local_6d8);
  }
  local_9 = 1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
             *)0xbf6394);
  if ((local_9 & 1) == 0) {
    ScalarFunctionSet::~ScalarFunctionSet((ScalarFunctionSet *)0xbf63bc);
  }
  return in_RDI;
}

Assistant:

ScalarFunctionSet MakeDateFun::GetFunctions() {
	ScalarFunctionSet make_date("make_date");
	make_date.AddFunction(ScalarFunction({LogicalType::INTEGER}, LogicalType::DATE, MakeDateFromEpoch));
	make_date.AddFunction(ScalarFunction({LogicalType::BIGINT, LogicalType::BIGINT, LogicalType::BIGINT},
	                                     LogicalType::DATE, ExecuteMakeDate<int64_t>));

	child_list_t<LogicalType> make_date_children {
	    {"year", LogicalType::BIGINT}, {"month", LogicalType::BIGINT}, {"day", LogicalType::BIGINT}};
	make_date.AddFunction(
	    ScalarFunction({LogicalType::STRUCT(make_date_children)}, LogicalType::DATE, ExecuteStructMakeDate<int64_t>));
	for (auto &func : make_date.functions) {
		BaseScalarFunction::SetReturnsError(func);
	}
	return make_date;
}